

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O3

int target_data_update(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                      int64_t *arg_sizes,int64_t *arg_types)

{
  _Rb_tree_header *p_Var1;
  undefined8 *HstPtrBegin;
  long Size;
  undefined8 *puVar2;
  DeviceTy *pDVar3;
  int32_t iVar4;
  int iVar5;
  void *TgtPtrBegin;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  bool IsLast;
  bool local_69;
  pthread_mutex_t *local_68;
  DeviceTy *local_60;
  int64_t *local_58;
  void *local_50;
  ulong local_48;
  void **local_40;
  int64_t *local_38;
  
  if (0 < arg_num) {
    local_68 = (pthread_mutex_t *)&Device->ShadowMtx;
    p_Var1 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header;
    uVar8 = (ulong)(uint)arg_num;
    bVar10 = true;
    uVar9 = 0;
    local_60 = Device;
    local_58 = arg_types;
    local_48 = uVar8;
    local_40 = args;
    local_38 = arg_sizes;
    do {
      if ((*(ushort *)(arg_types + uVar9) & 0x180) == 0) {
        HstPtrBegin = (undefined8 *)local_40[uVar9];
        Size = local_38[uVar9];
        TgtPtrBegin = DeviceTy::getTgtPtrBegin(local_60,HstPtrBegin,Size,&local_69,false);
        pDVar3 = local_60;
        uVar8 = local_48;
        if (TgtPtrBegin != (void *)0x0) {
          uVar7 = arg_types[uVar9];
          if ((uVar7 & 2) != 0) {
            local_50 = TgtPtrBegin;
            iVar4 = DeviceTy::data_retrieve(local_60,HstPtrBegin,TgtPtrBegin,Size);
            if (iVar4 != 0) goto LAB_0010742d;
            iVar5 = pthread_mutex_lock(local_68);
            if (iVar5 != 0) goto LAB_00107445;
            p_Var6 = (pDVar3->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var6 != p_Var1) {
              do {
                puVar2 = *(undefined8 **)(p_Var6 + 1);
                if (HstPtrBegin <= puVar2) {
                  if ((undefined8 *)(Size + (long)HstPtrBegin) <= puVar2) break;
                  *puVar2 = p_Var6[1]._M_parent;
                }
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
              } while ((_Rb_tree_header *)p_Var6 != p_Var1);
            }
            pthread_mutex_unlock(local_68);
            uVar7 = local_58[uVar9];
            TgtPtrBegin = local_50;
            arg_types = local_58;
          }
          pDVar3 = local_60;
          uVar8 = local_48;
          if ((uVar7 & 1) != 0) {
            iVar4 = DeviceTy::data_submit(local_60,TgtPtrBegin,HstPtrBegin,Size);
            if (iVar4 != 0) {
LAB_0010742d:
              return -(uint)bVar10;
            }
            iVar5 = pthread_mutex_lock(local_68);
            if (iVar5 != 0) {
LAB_00107445:
              std::__throw_system_error(iVar5);
            }
            p_Var6 = (pDVar3->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var6 != p_Var1) {
              do {
                if (HstPtrBegin <= *(undefined8 **)(p_Var6 + 1)) {
                  if ((undefined8 *)(Size + (long)HstPtrBegin) <= *(undefined8 **)(p_Var6 + 1))
                  break;
                  iVar4 = DeviceTy::data_submit(local_60,p_Var6[1]._M_left,&p_Var6[1]._M_right,8);
                  if (iVar4 != 0) {
                    pthread_mutex_unlock(local_68);
                    goto LAB_0010742d;
                  }
                }
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
              } while ((_Rb_tree_header *)p_Var6 != p_Var1);
            }
            pthread_mutex_unlock(local_68);
            uVar8 = local_48;
            arg_types = local_58;
          }
        }
      }
      uVar9 = uVar9 + 1;
      bVar10 = uVar9 < uVar8;
    } while (uVar9 != uVar8);
  }
  return 0;
}

Assistant:

int target_data_update(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t MapSize = arg_sizes[i];
    bool IsLast;
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, MapSize, IsLast,
        false);
    if (!TgtPtrBegin) {
      DP("hst data:" DPxMOD " not found, becomes a noop\n", DPxPTR(HstPtrBegin));
      continue;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
      DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
      int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data from device failed.\n");
        return OFFLOAD_FAIL;
      }

      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original host pointer value " DPxMOD " for host pointer "
            DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
            DPxPTR(ShadowHstPtrAddr));
        *ShadowHstPtrAddr = it->second.HstPtrVal;
      }
      Device.ShadowMtx.unlock();
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
          arg_sizes[i], DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
      int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, MapSize);
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + MapSize;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;
        DP("Restoring original target pointer value " DPxMOD " for target "
            "pointer " DPxMOD "\n", DPxPTR(it->second.TgtPtrVal),
            DPxPTR(it->second.TgtPtrAddr));
        rt = Device.data_submit(it->second.TgtPtrAddr,
            &it->second.TgtPtrVal, sizeof(void *));
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          Device.ShadowMtx.unlock();
          return OFFLOAD_FAIL;
        }
      }
      Device.ShadowMtx.unlock();
    }
  }
  return OFFLOAD_SUCCESS;
}